

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int HistoryItemRevealBitmask(pyhanabi_history_item_t *item)

{
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x10b,"int HistoryItemRevealBitmask(pyhanabi_history_item_t *)");
  }
  if (*in_RDI != 0) {
    return (int)*(byte *)(*in_RDI + 0xd);
  }
  __assert_fail("item->item != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x10c,"int HistoryItemRevealBitmask(pyhanabi_history_item_t *)");
}

Assistant:

int HistoryItemRevealBitmask(pyhanabi_history_item_t* item) {
  REQUIRE(item != nullptr);
  REQUIRE(item->item != nullptr);
  return reinterpret_cast<const hanabi_learning_env::HanabiHistoryItem*>(
             item->item)
      ->reveal_bitmask;
}